

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

Logon * anon_unknown.dwarf_5319c9::createT11Logon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  long *local_a0;
  long local_98;
  long local_90 [2];
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  char local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  field_metrics local_30;
  
  FIXT11::Logon::Logon(__return_storage_ptr__);
  FIX::IntField::IntField((IntField *)local_80,0x62,0);
  local_80._0_8_ = &PTR__FieldBase_00329eb0;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_80,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_80);
  FIX::IntField::IntField((IntField *)local_80,0x6c,0x1e);
  local_80._0_8_ = &PTR__FieldBase_00329ee8;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_80,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_80);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"7","");
  local_80._0_8_ = &PTR__FieldBase_003239f8;
  local_80._8_4_ = 0x471;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_a0,local_98 + (long)local_a0);
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30.m_length = 0;
  local_30.m_checksum = 0;
  local_80._0_8_ = &PTR__FieldBase_0032d988;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_80,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_80);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)local_80,9,iVar1);
  local_80._0_8_ = &PTR__FieldBase_00327ea8;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_80,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_80);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)local_80,10,iVar1);
  local_80._0_8_ = &PTR__FieldBase_00328060;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,(FieldBase *)local_80,
             true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_80);
  return __return_storage_ptr__;
}

Assistant:

FIXT11::Logon createT11Logon(const char *sender, const char *target, int seq) {
  FIXT11::Logon logon;
  logon.set(EncryptMethod(0));
  logon.set(HeartBtInt(30));
  logon.set(DefaultApplVerID("7"));
  fillHeader(logon.getHeader(), sender, target, seq);
  logon.getHeader().setField(BodyLength(logon.bodyLength()));
  logon.getTrailer().setField(CheckSum(logon.checkSum()));
  return logon;
}